

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

bool __thiscall
QToolBarAreaLayoutInfo::insertGap(QToolBarAreaLayoutInfo *this,QList<int> *path,QLayoutItem *item)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  QToolBarAreaLayoutItem *this_00;
  QToolBarAreaLayoutItem *pQVar4;
  reference pQVar5;
  const_reference piVar6;
  reference pQVar7;
  QToolBarAreaLayoutLine *in_RDI;
  long in_FS_OFFSET;
  int previousExtraSpace;
  int previousSizeHint;
  QToolBarAreaLayoutItem *previous;
  int p;
  int k;
  QToolBarAreaLayoutLine *line;
  int j;
  QToolBarAreaLayoutItem gap_item;
  undefined4 in_stack_ffffffffffffff48;
  Orientation in_stack_ffffffffffffff4c;
  QToolBarAreaLayoutItem *in_stack_ffffffffffffff60;
  int local_88;
  int newSize;
  undefined1 local_20 [16];
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  piVar3 = QList<int>::first((QList<int> *)in_RDI);
  this_00 = (QToolBarAreaLayoutItem *)(long)*piVar3;
  pQVar4 = (QToolBarAreaLayoutItem *)
           QList<QToolBarAreaLayoutLine>::size((QList<QToolBarAreaLayoutLine> *)in_RDI);
  if (this_00 == pQVar4) {
    QToolBarAreaLayoutLine::QToolBarAreaLayoutLine(in_RDI,in_stack_ffffffffffffff4c);
    QList<QToolBarAreaLayoutLine>::append
              ((QList<QToolBarAreaLayoutLine> *)in_RDI,
               (rvalue_ref)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    QToolBarAreaLayoutLine::~QToolBarAreaLayoutLine((QToolBarAreaLayoutLine *)0x6f21e1);
  }
  pQVar5 = QList<QToolBarAreaLayoutLine>::operator[]
                     ((QList<QToolBarAreaLayoutLine> *)in_RDI,
                      CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  piVar6 = QList<int>::at((QList<int> *)in_RDI,
                          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  newSize = *piVar6;
  local_20._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_20._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QToolBarAreaLayoutItem::QToolBarAreaLayoutItem
            ((QToolBarAreaLayoutItem *)local_20,(QLayoutItem *)0x0);
  local_10._4_1_ = true;
  local_88 = newSize;
  do {
    local_88 = local_88 + -1;
    if (local_88 < 0) goto LAB_006f2340;
    pQVar7 = QList<QToolBarAreaLayoutItem>::operator[]
                       ((QList<QToolBarAreaLayoutItem> *)in_RDI,
                        CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    bVar1 = QToolBarAreaLayoutItem::skip(this_00);
  } while (bVar1);
  in_stack_ffffffffffffff4c = pQVar5->o;
  QToolBarAreaLayoutItem::sizeHint((QToolBarAreaLayoutItem *)in_RDI);
  iVar2 = pick((Orientation)((ulong)in_RDI >> 0x20),
               (QSize *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  if (0 < pQVar7->size - iVar2) {
    pQVar7->preferredSize = -1;
    pQVar7->size = iVar2;
    QToolBarAreaLayoutItem::resize
              (in_stack_ffffffffffffff60,(Orientation)((ulong)this_00 >> 0x20),newSize);
  }
LAB_006f2340:
  QList<QToolBarAreaLayoutItem>::insert
            ((QList<QToolBarAreaLayoutItem> *)this_00,(qsizetype)in_RDI,
             (parameter_type)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return true;
}

Assistant:

bool QToolBarAreaLayoutInfo::insertGap(const QList<int> &path, QLayoutItem *item)
{
    Q_ASSERT(path.size() == 2);
    int j = path.first();
    if (j == lines.size())
        lines.append(QToolBarAreaLayoutLine(o));

    QToolBarAreaLayoutLine &line = lines[j];
    const int k = path.at(1);

    QToolBarAreaLayoutItem gap_item;
    gap_item.gap = true;
    gap_item.widgetItem = item;

    //update the previous item's preferred size
    for(int p = k - 1 ; p >= 0; --p) {
        QToolBarAreaLayoutItem &previous = line.toolBarItems[p];
        if (!previous.skip()) {
            //we found the previous one
            int previousSizeHint = pick(line.o, previous.sizeHint());
            int previousExtraSpace = previous.size - previousSizeHint;

            if (previousExtraSpace > 0) {
                //in this case we reset the space
                previous.preferredSize = -1;
                previous.size = previousSizeHint;

                gap_item.resize(o, previousExtraSpace);
            }

            break;
        }
    }

    line.toolBarItems.insert(k, gap_item);
    return true;

}